

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderBasicData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::Mode5TransponderBasicData::SetFigureOfMerit
          (Mode5TransponderBasicData *this,KUINT8 FOM)

{
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  KUINT8 local_11;
  Mode5TransponderBasicData *pMStack_10;
  KUINT8 FOM_local;
  Mode5TransponderBasicData *this_local;
  
  if (0x1f < FOM) {
    local_11 = FOM;
    pMStack_10 = this;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"SetFigureOfMerit",&local_39);
    KException::KException<char_const*>(this_00,&local_38,8,"Value must be between 0-31.");
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  this->m_ui8FigMerit = FOM;
  return;
}

Assistant:

void Mode5TransponderBasicData::SetFigureOfMerit(KUINT8 FOM) noexcept(false)
{
    if( FOM > 31 )throw KException( __FUNCTION__, INVALID_DATA, "Value must be between 0-31." );
    m_ui8FigMerit = FOM;
}